

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::setRoot
          (const_iterator *this,uint32_t offset)

{
  uint32_t local_10;
  uint32_t local_c;
  IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U> *local_8;
  
  local_8 = this->map;
  local_c = local_8->rootSize;
  local_10 = offset;
  if (local_8->height == 0) {
    (this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len = 0;
    SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
    emplace_back<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::ValueDriver_const*,8u,true>*&,unsigned_int&,unsigned_int&>
              ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&this->path,
               (LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true> **)&local_8,
               &local_c,&local_10);
  }
  else {
    (this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len = 0;
    SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
    emplace_back<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,true>*&,unsigned_int&,unsigned_int&>
              ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&this->path,
               (BranchNode<unsigned_long,_8U,_true> **)&local_8,&local_c,&local_10);
  }
  return;
}

Assistant:

void setRoot(uint32_t offset) {
        if (isFlat())
            path.setRoot(&map->rootLeaf, map->rootSize, offset);
        else
            path.setRoot(&map->rootBranch, map->rootSize, offset);
    }